

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_code_copy(archive *a,la_zstream *lastrm,la_zaction action)

{
  size_t local_30;
  size_t bytes;
  la_zaction action_local;
  la_zstream *lastrm_local;
  archive *a_local;
  
  if (lastrm->avail_in < lastrm->avail_out) {
    local_30 = lastrm->avail_in;
  }
  else {
    local_30 = lastrm->avail_out;
  }
  if (local_30 != 0) {
    memcpy(lastrm->next_out,lastrm->next_in,local_30);
    lastrm->next_in = lastrm->next_in + local_30;
    lastrm->avail_in = lastrm->avail_in - local_30;
    lastrm->total_in = local_30 + lastrm->total_in;
    lastrm->next_out = lastrm->next_out + local_30;
    lastrm->avail_out = lastrm->avail_out - local_30;
    lastrm->total_out = local_30 + lastrm->total_out;
  }
  if ((action == ARCHIVE_Z_FINISH) && (lastrm->avail_in == 0)) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_code_copy(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	size_t bytes;

	(void)a; /* UNUSED */
	if (lastrm->avail_out > lastrm->avail_in)
		bytes = lastrm->avail_in;
	else
		bytes = lastrm->avail_out;
	if (bytes) {
		memcpy(lastrm->next_out, lastrm->next_in, bytes);
		lastrm->next_in += bytes;
		lastrm->avail_in -= bytes;
		lastrm->total_in += bytes;
		lastrm->next_out += bytes;
		lastrm->avail_out -= bytes;
		lastrm->total_out += bytes;
	}
	if (action == ARCHIVE_Z_FINISH && lastrm->avail_in == 0)
		return (ARCHIVE_EOF);
	return (ARCHIVE_OK);
}